

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

void __thiscall
llvm::StringRef::split
          (StringRef *this,SmallVectorImpl<llvm::StringRef> *A,StringRef Separator,int MaxSplit,
          bool KeepEmpty)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  bool bVar4;
  StringRef SVar5;
  char *local_78;
  char *local_70;
  StringRef local_68;
  StringRef *local_58;
  char *local_50;
  size_t local_48;
  size_t Idx;
  StringRef S;
  bool KeepEmpty_local;
  int MaxSplit_local;
  SmallVectorImpl<llvm::StringRef> *A_local;
  StringRef *this_local;
  StringRef Separator_local;
  
  Separator_local.Data = (char *)Separator.Length;
  this_local = (StringRef *)Separator.Data;
  Idx = (size_t)this->Data;
  S.Data = (char *)this->Length;
  S.Length._3_1_ = KeepEmpty;
  S.Length._4_4_ = MaxSplit;
  while (iVar3 = S.Length._4_4_ + -1, bVar4 = S.Length._4_4_ != 0, S.Length._4_4_ = iVar3, bVar4) {
    local_58 = this_local;
    local_50 = Separator_local.Data;
    SVar5.Length = (size_t)Separator_local.Data;
    SVar5.Data = (char *)this_local;
    local_48 = find((StringRef *)&Idx,SVar5,0);
    if (local_48 == 0xffffffffffffffff) break;
    if (((S.Length._3_1_ & 1) != 0) || (local_48 != 0)) {
      local_68 = slice((StringRef *)&Idx,0,local_48);
      SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                (&A->super_SmallVectorTemplateBase<llvm::StringRef,_true>,&local_68);
    }
    sVar1 = local_48;
    sVar2 = size((StringRef *)&this_local);
    SVar5 = slice((StringRef *)&Idx,sVar1 + sVar2,0xffffffffffffffff);
    local_78 = SVar5.Data;
    Idx = (size_t)local_78;
    local_70 = (char *)SVar5.Length;
    S.Data = local_70;
  }
  if (((S.Length._3_1_ & 1) != 0) || (bVar4 = empty((StringRef *)&Idx), !bVar4)) {
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              (&A->super_SmallVectorTemplateBase<llvm::StringRef,_true>,(StringRef *)&Idx);
  }
  return;
}

Assistant:

void StringRef::split(SmallVectorImpl<StringRef> &A,
                      StringRef Separator, int MaxSplit,
                      bool KeepEmpty) const {
  StringRef S = *this;

  // Count down from MaxSplit. When MaxSplit is -1, this will just split
  // "forever". This doesn't support splitting more than 2^31 times
  // intentionally; if we ever want that we can make MaxSplit a 64-bit integer
  // but that seems unlikely to be useful.
  while (MaxSplit-- != 0) {
    size_t Idx = S.find(Separator);
    if (Idx == npos)
      break;

    // Push this split.
    if (KeepEmpty || Idx > 0)
      A.push_back(S.slice(0, Idx));

    // Jump forward.
    S = S.slice(Idx + Separator.size(), npos);
  }

  // Push the tail.
  if (KeepEmpty || !S.empty())
    A.push_back(S);
}